

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_heat_maps.h
# Opt level: O3

void __thiscall
Gudhi::Persistence_representations::
Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::construct
          (Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
           *this,vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 *intervals_,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *filter,bool erase_below_diagonal,size_t number_of_pixels,double min_,double max_)

{
  ulong uVar1;
  pointer ppVar2;
  pointer pvVar3;
  long lVar4;
  double *pdVar5;
  undefined7 in_register_00000009;
  long lVar6;
  size_t __n;
  long lVar7;
  ulong uVar8;
  int iVar9;
  pointer pvVar10;
  ulong uVar11;
  ulong uVar12;
  pointer pvVar13;
  long lVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  heat_map_;
  vector<double,_std::allocator<double>_> v;
  allocator_type local_91;
  pointer local_90;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *local_88;
  undefined4 local_7c;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_78;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_60;
  pointer local_58;
  value_type_conflict1 local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  local_7c = (undefined4)CONCAT71(in_register_00000009,erase_below_diagonal);
  if ((min_ == max_) && (!NAN(min_) && !NAN(max_))) {
    ppVar2 = (intervals_->
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar6 = (long)(intervals_->
                  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2;
    if (lVar6 == 0) {
      dVar15 = 2147483647.0;
      dVar16 = -2147483647.0;
    }
    else {
      lVar6 = lVar6 >> 4;
      pdVar5 = &ppVar2->second;
      dVar16 = -2147483647.0;
      dVar17 = 2147483647.0;
      do {
        dVar15 = ((pair<double,_double> *)(pdVar5 + -1))->first;
        if (dVar17 <= ((pair<double,_double> *)(pdVar5 + -1))->first) {
          dVar15 = dVar17;
        }
        dVar17 = *pdVar5;
        if (*pdVar5 <= dVar16) {
          dVar17 = dVar16;
        }
        dVar16 = dVar17;
        pdVar5 = pdVar5 + 2;
        lVar6 = lVar6 + -1;
        dVar17 = dVar15;
      } while (lVar6 != 0);
    }
    min_ = dVar15 - ABS(dVar16 - dVar15) / 100.0;
    max_ = ABS(dVar16 - min_) / 100.0 + dVar16;
  }
  this->min_ = min_;
  this->max_ = max_;
  local_78.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90 = (pointer)number_of_pixels;
  local_88 = intervals_;
  local_60 = filter;
  if (number_of_pixels != 0) {
    do {
      local_50 = 0.0;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_48,(size_type)local_90,&local_50,&local_91);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back(&local_78,&local_48);
      if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      number_of_pixels = number_of_pixels - 1;
    } while (number_of_pixels != 0);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=(&this->heat_map,&local_78);
  local_58 = (local_88->
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  local_88 = (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             ((long)(local_88->
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)local_58);
  if (local_88 !=
      (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)0x0) {
    local_88 = (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               ((long)local_88 >> 4);
    dVar15 = ((double)CONCAT44(0x45300000,(int)((ulong)local_90 >> 0x20)) - 1.9342813113834067e+25)
             + ((double)CONCAT44(0x43300000,(int)local_90) - 4503599627370496.0);
    pvVar13 = (local_60->
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_90 = (local_60->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    uVar8 = ((long)local_90 - (long)pvVar13 >> 3) * -0x5555555555555555;
    lVar6 = 0;
    do {
      if (local_90 != pvVar13) {
        dVar16 = local_58[lVar6].first;
        dVar17 = this->min_;
        dVar18 = this->max_ - dVar17;
        iVar9 = (int)(uVar8 >> 1);
        pvVar3 = (this->heat_map).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar12 = ((long)(this->heat_map).
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
                 -0x5555555555555555;
        lVar14 = (long)((int)(((local_58[lVar6].second - dVar17) / dVar18) * dVar15) - iVar9);
        uVar11 = 0;
        do {
          uVar1 = (long)((int)(((dVar16 - dVar17) / dVar18) * dVar15) - iVar9) + uVar11;
          lVar7 = 0;
          pvVar10 = pvVar3 + lVar14;
          do {
            if ((uVar1 < uVar12) && ((ulong)(lVar14 + lVar7) < uVar12)) {
              lVar4 = *(long *)&(pvVar10->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl.super__Vector_impl_data;
              *(double *)(lVar4 + uVar1 * 8) =
                   pvVar13[uVar11].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar7] + *(double *)(lVar4 + uVar1 * 8);
            }
            lVar7 = lVar7 + 1;
            pvVar10 = pvVar10 + 1;
          } while (uVar8 - lVar7 != 0);
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar8);
      }
      lVar6 = lVar6 + 1;
    } while ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)lVar6
             != local_88);
  }
  if ((char)local_7c != '\0') {
    pvVar13 = (this->heat_map).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar6 = (long)(this->heat_map).
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar13;
    if (lVar6 != 0) {
      lVar6 = lVar6 >> 3;
      __n = lVar6 * 0x5555555555555558;
      lVar14 = 0;
      do {
        memset((void *)(lVar14 * 8 +
                       *(long *)&(pvVar13->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data),0,__n);
        lVar14 = lVar14 + 1;
        __n = __n - 8;
        pvVar13 = pvVar13 + 1;
      } while (lVar6 * -0x5555555555555555 - lVar14 != 0);
    }
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_78);
  return;
}

Assistant:

void Persistence_heat_maps<Scalling_of_kernels>::construct(const std::vector<std::pair<double, double> >& intervals_,
                                                           std::vector<std::vector<double> > filter,
                                                           bool erase_below_diagonal, size_t number_of_pixels,
                                                           double min_, double max_) {
  bool dbg = false;
  if (dbg) std::clog << "Entering construct procedure \n";
  Scalling_of_kernels f;
  this->f = f;

  if (dbg) std::clog << "min and max passed to construct() procedure: " << min_ << " " << max_ << std::endl;

  if (min_ == max_) {
    if (dbg) std::clog << "min and max parameters will be determined based on intervals \n";
    // in this case, we want the program to set up the min_ and max_ values by itself.
    min_ = std::numeric_limits<int>::max();
    max_ = -std::numeric_limits<int>::max();

    for (size_t i = 0; i != intervals_.size(); ++i) {
      if (intervals_[i].first < min_) min_ = intervals_[i].first;
      if (intervals_[i].second > max_) max_ = intervals_[i].second;
    }
    // now we have the structure filled in, and moreover we know min_ and max_ values of the interval, so we know the
    // range.

    // add some more space:
    min_ -= fabs(max_ - min_) / 100;
    max_ += fabs(max_ - min_) / 100;
  }

  if (dbg) {
    std::clog << "min_ : " << min_ << std::endl;
    std::clog << "max_ : " << max_ << std::endl;
    std::clog << "number_of_pixels : " << number_of_pixels << std::endl;
    getchar();
  }

  this->min_ = min_;
  this->max_ = max_;

  // initialization of the structure heat_map
  std::vector<std::vector<double> > heat_map_;
  for (size_t i = 0; i != number_of_pixels; ++i) {
    std::vector<double> v(number_of_pixels, 0);
    heat_map_.push_back(v);
  }
  this->heat_map = heat_map_;

  if (dbg) std::clog << "Done creating of the heat map, now we will fill in the structure \n";

  for (size_t pt_nr = 0; pt_nr != intervals_.size(); ++pt_nr) {
    // compute the value of intervals_[pt_nr] in the grid:
    int x_grid =
        static_cast<int>((intervals_[pt_nr].first - this->min_) / (this->max_ - this->min_) * number_of_pixels);
    int y_grid =
        static_cast<int>((intervals_[pt_nr].second - this->min_) / (this->max_ - this->min_) * number_of_pixels);

    if (dbg) {
      std::clog << "point : " << intervals_[pt_nr].first << " , " << intervals_[pt_nr].second << std::endl;
      std::clog << "x_grid : " << x_grid << std::endl;
      std::clog << "y_grid : " << y_grid << std::endl;
    }

    // x_grid and y_grid gives a center of the kernel. We want to have its lower left corner. To get this, we need to
    // shift x_grid and y_grid by a grid diameter.
    x_grid -= filter.size() / 2;
    y_grid -= filter.size() / 2;
    // note that the numbers x_grid and y_grid may be negative.

    if (dbg) {
      std::clog << "After shift : \n";
      std::clog << "x_grid : " << x_grid << std::endl;
      std::clog << "y_grid : " << y_grid << std::endl;
    }

    double scaling_value = this->f(intervals_[pt_nr]);

    for (size_t i = 0; i != filter.size(); ++i) {
      for (size_t j = 0; j != filter.size(); ++j) {
        // if the point (x_grid+i,y_grid+j) is the correct point in the grid.
        if (((x_grid + i) >= 0) && (x_grid + i < this->heat_map.size()) && ((y_grid + j) >= 0) &&
            (y_grid + j < this->heat_map.size())) {
          if (dbg) {
            std::clog << y_grid + j << " " << x_grid + i << std::endl;
          }
          this->heat_map[y_grid + j][x_grid + i] += scaling_value * filter[i][j];
          if (dbg) {
            std::clog << "Position : (" << x_grid + i << "," << y_grid + j
                      << ") got increased by the value : " << filter[i][j] << std::endl;
          }
        }
      }
    }
  }

  // now it remains to cut everything below diagonal if the user wants us to.
  if (erase_below_diagonal) {
    for (size_t i = 0; i != this->heat_map.size(); ++i) {
      for (size_t j = i; j != this->heat_map.size(); ++j) {
        this->heat_map[i][j] = 0;
      }
    }
  }
}